

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void setup::anon_unknown_21::load_wizard_and_decompressor
               (istream *is,version *version,header *header,info *info,entry_types entries)

{
  compression_method cVar1;
  bool bVar2;
  bool bVar3;
  flags<setup::header::flags_Enum_,_65UL> fVar4;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&info->wizard_images,
                    (info->wizard_images).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&info->wizard_images_small,
                    (info->wizard_images_small).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  load_wizard_images(is,version,&info->wizard_images,entries);
  if ((0x1ffffff < version->value) ||
     (((version->variant)._flags.super__Base_bitset<1UL>._M_w & 4) != 0)) {
    load_wizard_images(is,version,&info->wizard_images_small,entries);
  }
  (info->decompressor_dll)._M_string_length = 0;
  *(info->decompressor_dll)._M_dataplus._M_p = '\0';
  cVar1 = header->compression;
  if (cVar1 == Zlib) {
    if (version->value < 0x4020600) goto LAB_0013a003;
  }
  else if ((cVar1 != BZip2) && ((cVar1 != LZMA1 || (version->value != 0x4010500))))
  goto LAB_0013a003;
  if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w & 0xa0000) == 0) {
    util::binary_string::skip(is);
  }
  else {
    util::binary_string::load(is,&info->decompressor_dll);
  }
LAB_0013a003:
  (info->decrypt_dll)._M_string_length = 0;
  *(info->decrypt_dll)._M_dataplus._M_p = '\0';
  fVar4 = flags<setup::header::flags_Enum_,_65UL>::operator&(&header->options,EncryptionUsed);
  bVar2 = true;
  if (fVar4._flags.super__Base_bitset<2UL>._M_w[0] == 0) {
    bVar3 = true;
    do {
      bVar2 = bVar3;
      if (!bVar2) break;
      bVar3 = false;
    } while (fVar4._flags.super__Base_bitset<2UL>._M_w[1] == 0);
  }
  if ((bVar2) && (version->value < 0x6040000)) {
    if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w & 0xc0000) != 0) {
      util::binary_string::load(is,&info->decrypt_dll);
      return;
    }
    util::binary_string::skip(is);
    return;
  }
  return;
}

Assistant:

void load_wizard_and_decompressor(std::istream & is, const setup::version & version,
                                  const setup::header & header,
                                  setup::info & info, info::entry_types entries) {
	
	info.wizard_images.clear();
	info.wizard_images_small.clear();
	
	load_wizard_images(is, version, info.wizard_images, entries);
	
	if(version >= INNO_VERSION(2, 0, 0) || version.is_isx()) {
		load_wizard_images(is, version, info.wizard_images_small, entries);
	}
	
	info.decompressor_dll.clear();
	if(header.compression == stream::BZip2
	   || (header.compression == stream::LZMA1 && version == INNO_VERSION(4, 1, 5))
	   || (header.compression == stream::Zlib && version >= INNO_VERSION(4, 2, 6))) {
		if(entries & (info::DecompressorDll | info::NoSkip)) {
			is >> util::binary_string(info.decompressor_dll);
		} else {
			// decompressor dll - we don't need this
			util::binary_string::skip(is);
		}
	}
	
	info.decrypt_dll.clear();
	if((header.options & header::EncryptionUsed) && version < INNO_VERSION(6, 4, 0)) {
		if(entries & (info::DecryptDll | info::NoSkip)) {
			is >> util::binary_string(info.decrypt_dll);
		} else {
			// decrypt dll - we don't need this
			util::binary_string::skip(is);
		}
	}
	
}